

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O3

void __thiscall
LSL_RLEZ<TTA>::PerformLabelingMem
          (LSL_RLEZ<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint u;
  Mat *m;
  pointer puVar4;
  pointer puVar5;
  double dVar6;
  pointer puVar7;
  pointer piVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  uint uVar10;
  long lVar11;
  int *piVar12;
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  long lVar15;
  int *piVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  long lVar25;
  int iVar26;
  double dVar27;
  double dVar28;
  MemVector<int> ner;
  MemMat<int> ERA;
  MemMat<int> RLC;
  MemMat<int> ER;
  MemMat<int> labels;
  MemMat<int> img;
  MemVector<int> local_548;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_518;
  long *local_510;
  long local_508;
  long *local_500;
  long local_4f8;
  undefined4 local_4f0;
  Mat *local_4e8;
  undefined8 local_4e0;
  undefined1 local_4d8 [104];
  Mat local_470 [16];
  long local_460;
  long *local_428;
  Mat_<int> local_410;
  undefined1 local_3b0 [104];
  Mat local_348 [16];
  long local_338;
  long *local_300;
  undefined1 local_2e8 [104];
  Mat local_280 [16];
  long local_270;
  long *local_238;
  undefined1 local_220 [104];
  Mat local_1b8 [16];
  long local_1a8;
  long *local_170;
  undefined1 local_158 [104];
  Mat local_f0 [16];
  long local_e0;
  long *local_a8;
  Mat_<int> local_90;
  
  m = &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat;
  uVar2 = *(uint *)(m + 8);
  uVar14 = (ulong)uVar2;
  uVar3 = *(uint *)(m + 0xc);
  cv::Mat::Mat(&local_90.super_Mat);
  local_90._0_4_ = local_90._0_4_ & 0xfffff000 | 4;
  cv::Mat_<int>::operator=((Mat_<int> *)&local_90.super_Mat,m);
  MemMat<int>::MemMat((MemMat<int> *)local_158,&local_90);
  cv::Mat::~Mat(&local_90.super_Mat);
  local_3b0._0_4_ = uVar3;
  local_3b0._4_4_ = uVar2;
  MemMat<int>::MemMat((MemMat<int> *)local_2e8,(Size *)local_3b0);
  local_4d8._0_4_ = uVar3 + 1 & 0xfffffffe;
  local_4d8._4_4_ = uVar2;
  MemMat<int>::MemMat((MemMat<int> *)local_3b0,(Size *)local_4d8);
  local_518 = accesses;
  MemVector<int>::MemVector(&local_548,(long)(int)uVar2);
  if (0 < (int)uVar2) {
    local_4f8 = local_338;
    local_500 = local_300;
    local_508 = local_3b0._24_8_;
    local_510 = (long *)local_3b0._80_8_;
    uVar18 = 0;
    do {
      iVar26 = 0;
      iVar22 = 0;
      if (0 < (int)uVar3) {
        lVar19 = *local_238;
        lVar17 = *(long *)local_2e8._80_8_;
        lVar20 = *(long *)local_158._80_8_;
        lVar11 = *local_a8;
        uVar23 = 0;
        iVar26 = 0;
        bVar24 = false;
        do {
          piVar12 = (int *)(lVar11 * uVar18 + local_e0 + uVar23 * 4);
          *piVar12 = *piVar12 + 1;
          iVar22 = *(int *)(lVar20 * uVar18 + local_158._24_8_ + uVar23 * 4);
          if (bVar24 != 0 < iVar22) {
            piVar12 = (int *)(*local_300 * uVar18 + local_338 + (long)iVar26 * 4);
            *piVar12 = *piVar12 + 1;
            *(int *)(*(long *)local_3b0._80_8_ * uVar18 + local_3b0._24_8_ + (long)iVar26 * 4) =
                 (int)uVar23;
            iVar26 = iVar26 + 1;
          }
          piVar12 = (int *)(lVar19 * uVar18 + local_270 + uVar23 * 4);
          *piVar12 = *piVar12 + 1;
          *(int *)(lVar17 * uVar18 + local_2e8._24_8_ + uVar23 * 4) = iVar26;
          uVar23 = uVar23 + 1;
          bVar24 = 0 < iVar22;
        } while (uVar3 != uVar23);
        if (iVar22 < 1) {
          iVar22 = 0;
        }
        else {
          piVar12 = (int *)(*local_300 * uVar18 + local_338 + (long)iVar26 * 4);
          *piVar12 = *piVar12 + 1;
          *(uint *)(*(long *)local_3b0._80_8_ * uVar18 + local_3b0._24_8_ + (long)iVar26 * 4) =
               uVar3;
          iVar22 = 1;
        }
      }
      local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18] =
           local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar18] + 1;
      local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar18] = iVar26 + iVar22;
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar14);
  }
  local_220._0_4_ = uVar3 + 1;
  local_220._4_4_ = uVar2;
  MemMat<int>::MemMat((MemMat<int> *)local_4d8,(Size *)local_220,0);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::MemAlloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  TTA::length_ = 1;
  *local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
   ._M_start = *local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
  if (0 < *local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start) {
    lVar19 = 1;
    do {
      uVar10 = TTA::MemNewLabel();
      piVar12 = (int *)(local_460 + lVar19 * 4);
      *piVar12 = *piVar12 + 1;
      *(uint *)(local_4d8._24_8_ + lVar19 * 4) = uVar10;
      *local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start =
           *local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + 1;
      lVar19 = lVar19 + 2;
    } while ((int)lVar19 <=
             *local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start);
  }
  if (1 < (int)uVar2) {
    uVar18 = 1;
    lVar19 = 0;
    piVar12 = local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar16 = local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar12[uVar18] = piVar12[uVar18] + 1;
      if (0 < piVar16[uVar18]) {
        lVar17 = uVar18 - 1;
        lVar20 = 1;
        do {
          lVar11 = *local_300 * uVar18 + local_338;
          piVar12 = (int *)(lVar11 + -4 + lVar20 * 4);
          *piVar12 = *piVar12 + 1;
          lVar15 = *(long *)local_3b0._80_8_ * uVar18 + local_3b0._24_8_;
          iVar22 = *(int *)(lVar15 + -4 + lVar20 * 4);
          piVar12 = (int *)(lVar11 + lVar20 * 4);
          *piVar12 = *piVar12 + 1;
          iVar26 = *(int *)(lVar15 + lVar20 * 4);
          lVar21 = *local_238 * lVar17 + local_270;
          lVar11 = (long)(int)(iVar22 - (uint)(0 < iVar22));
          piVar12 = (int *)(lVar21 + lVar11 * 4);
          *piVar12 = *piVar12 + 1;
          lVar15 = *(long *)local_2e8._80_8_ * lVar17 + local_2e8._24_8_;
          iVar22 = *(int *)(lVar15 + lVar11 * 4);
          lVar11 = (long)(int)(iVar26 - (uint)((int)uVar3 <= iVar26));
          piVar12 = (int *)(lVar21 + lVar11 * 4);
          *piVar12 = *piVar12 + 1;
          uVar10 = *(uint *)(lVar15 + lVar11 * 4);
          uVar23 = (long)iVar22 | 1;
          iVar22 = uVar10 + (uVar10 & 1) + -1;
          if (iVar22 < (int)uVar23) {
            uVar10 = TTA::MemNewLabel();
            piVar12 = (int *)(*local_428 * uVar18 + local_460 + lVar20 * 4);
            *piVar12 = *piVar12 + 1;
            lVar11 = *(long *)local_4d8._80_8_;
          }
          else {
            lVar15 = *local_428;
            piVar12 = (int *)(lVar15 * lVar17 + local_460 + uVar23 * 4);
            *piVar12 = *piVar12 + 1;
            lVar11 = *(long *)local_4d8._80_8_;
            iVar26 = *(int *)(lVar11 * lVar17 + local_4d8._24_8_ + uVar23 * 4);
            TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar26] =
                 TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar26] + 1;
            uVar10 = TTA::mem_rtable_.vec_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar26];
            iVar26 = (int)uVar23 + 2;
            if (iVar26 <= iVar22) {
              lVar11 = (long)iVar26;
              do {
                piVar12 = (int *)(*local_428 * lVar19 + local_460 + lVar11 * 4);
                *piVar12 = *piVar12 + 1;
                iVar26 = *(int *)(*(long *)local_4d8._80_8_ * lVar19 + local_4d8._24_8_ + lVar11 * 4
                                 );
                TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar26] =
                     TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar26] + 1;
                u = TTA::mem_rtable_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar26];
                if ((int)uVar10 < (int)u) {
                  TTA::MemUpdateTable(u,uVar10);
                }
                if ((int)u < (int)uVar10) {
                  TTA::MemUpdateTable(uVar10,u);
                  uVar10 = u;
                }
                lVar11 = lVar11 + 2;
              } while (lVar11 <= iVar22);
              lVar15 = *local_428;
              lVar11 = *(long *)local_4d8._80_8_;
            }
            piVar12 = (int *)(lVar15 * uVar18 + local_460 + lVar20 * 4);
            *piVar12 = *piVar12 + 1;
          }
          *(uint *)(lVar11 * uVar18 + local_4d8._24_8_ + lVar20 * 4) = uVar10;
          local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar18] =
               local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar18] + 1;
          lVar20 = lVar20 + 2;
          piVar12 = local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar16 = local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (lVar20 <= local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar18]);
      }
      uVar18 = uVar18 + 1;
      lVar19 = lVar19 + 1;
    } while (uVar18 != uVar14);
  }
  uVar10 = TTA::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
  local_410._0_4_ = uVar3;
  local_410._4_4_ = uVar2;
  MemMat<int>::MemMat((MemMat<int> *)local_220,(Size *)&local_410);
  piVar8 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)uVar2) {
    uVar18 = 0;
    do {
      if (0 < (int)uVar3) {
        lVar19 = *local_428;
        lVar17 = *(long *)local_4d8._80_8_;
        lVar20 = *local_170;
        lVar11 = *(long *)local_220._80_8_;
        lVar15 = *(long *)local_2e8._80_8_;
        lVar21 = *local_238;
        uVar23 = 0;
        do {
          piVar12 = (int *)(lVar21 * uVar18 + local_270 + uVar23 * 4);
          *piVar12 = *piVar12 + 1;
          lVar25 = (long)*(int *)(lVar15 * uVar18 + local_2e8._24_8_ + uVar23 * 4);
          piVar12 = (int *)(lVar19 * uVar18 + local_460 + lVar25 * 4);
          *piVar12 = *piVar12 + 1;
          iVar22 = *(int *)(lVar17 * uVar18 + local_4d8._24_8_ + lVar25 * 4);
          piVar8[iVar22] = piVar8[iVar22] + 1;
          uVar2 = puVar7[iVar22];
          piVar12 = (int *)(lVar20 * uVar18 + local_1a8 + uVar23 * 4);
          *piVar12 = *piVar12 + 1;
          *(uint *)(lVar11 * uVar18 + local_220._24_8_ + uVar23 * 4) = uVar2;
          uVar23 = uVar23 + 1;
        } while (uVar3 != uVar23);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar14);
  }
  pauVar13 = (undefined1 (*) [16])operator_new(0x20);
  pvVar9 = local_518;
  pauVar13[1] = (undefined1  [16])0x0;
  *pauVar13 = (undefined1  [16])0x0;
  puVar4 = (local_518->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (local_518->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (local_518->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar13;
  (local_518->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar13 + 2);
  (local_518->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar13 + 2);
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)puVar5 - (long)puVar4);
  }
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_f0;
  cv::sum((_InputArray *)&local_410);
  uVar14 = (ulong)(double)CONCAT44(local_410._4_4_,local_410._0_4_);
  *(pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)CONCAT44(local_410._4_4_,local_410._0_4_) - 9.223372036854776e+18) &
       (long)uVar14 >> 0x3f | uVar14;
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_1b8;
  cv::sum((_InputArray *)&local_410);
  uVar14 = (ulong)(double)CONCAT44(local_410._4_4_,local_410._0_4_);
  (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)uVar14 >> 0x3f &
       (long)((double)CONCAT44(local_410._4_4_,local_410._0_4_) - 9.223372036854776e+18) | uVar14;
  dVar27 = TTA::MemTotalAccesses();
  (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar27 >> 0x3f & (long)(dVar27 - 9.223372036854776e+18) | (long)dVar27;
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_280;
  cv::sum((_InputArray *)&local_410);
  dVar27 = (double)CONCAT44(local_410._4_4_,local_410._0_4_);
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_348;
  cv::sum((_InputArray *)&local_410);
  if ((long)local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    dVar28 = 0.0;
  }
  else {
    lVar19 = (long)local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar28 = 0.0;
    lVar17 = 0;
    do {
      dVar28 = dVar28 + (double)local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar19 + (ulong)(lVar19 == 0) != lVar17);
  }
  dVar6 = (double)CONCAT44(local_410._4_4_,local_410._0_4_);
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_470;
  cv::sum((_InputArray *)&local_410);
  dVar27 = dVar27 + dVar6 + dVar28 + (double)CONCAT44(local_410._4_4_,local_410._0_4_);
  uVar14 = (ulong)dVar27;
  (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[3] =
       (long)(dVar27 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14;
  MemMat<int>::GetImage(&local_410,(MemMat<int> *)local_220);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     &local_410.super_Mat);
  cv::Mat::~Mat(&local_410.super_Mat);
  cv::Mat::~Mat(local_1b8);
  cv::Mat::~Mat((Mat *)(local_220 + 8));
  cv::Mat::~Mat(local_470);
  cv::Mat::~Mat((Mat *)(local_4d8 + 8));
  if (local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (int *)0x0) {
    operator_delete(local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat(local_348);
  cv::Mat::~Mat((Mat *)(local_3b0 + 8));
  cv::Mat::~Mat(local_280);
  cv::Mat::~Mat((Mat *)(local_2e8 + 8));
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat((Mat *)(local_158 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        int rows = img_.rows;
        int cols = img_.cols;

        MemMat<int> img(img_);

        // Step 1
        MemMat<int> ER(rows, cols);   // Matrix of relative label (1 label/pixel) 
        MemMat<int> RLC(rows, (cols + 1) & ~1); // MISSING in the paper: RLC requires 2 values/run in row, so width must be next multiple of 2
        MemVector<int> ner(rows); //vector<int> ner(rows); // Number of runs 

        for (int r = 0; r < rows; ++r) {
            int x0;
            int x1 = 0; // Previous value of X
            int f = 0;  // Front detection
            ZOA_MOD0
            int er = 0;
            for (int c = 0; c < cols; ++c)
            {
                x0 = img(r, c) > 0;
                f = x0 ^ x1;
                RLE_MOD1{
                    RLC(r, er) = c ZOA_MOD1;
                    ZOA_MOD2
                        er = er + RLE_MOD2;
                }
                ER(r, c) = er;
                x1 = x0;
            }
            ZOA_MOD3
                RLC(r, er) = cols ZOA_MOD1;
            ZOA_MOD4
                ner[r] = er;
        }